

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# title.c
# Opt level: O0

int main(void)

{
  int iVar1;
  GLFWwindow *handle;
  GLFWwindow *window;
  
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  handle = glfwCreateWindow(400,400,anon_var_dwarf_23,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    glfwTerminate();
    exit(1);
  }
  glfwMakeContextCurrent(handle);
  gladLoadGL(glfwGetProcAddress);
  glfwSwapInterval(1);
  while( true ) {
    iVar1 = glfwWindowShouldClose(handle);
    if (iVar1 != 0) break;
    (*glad_glClear)(0x4000);
    glfwSwapBuffers(handle);
    glfwWaitEvents();
  }
  glfwTerminate();
  exit(0);
}

Assistant:

int main(void)
{
    GLFWwindow* window;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    window = glfwCreateWindow(400, 400, "English 日本語 русский язык 官話", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);
    glfwSwapInterval(1);

    while (!glfwWindowShouldClose(window))
    {
        glClear(GL_COLOR_BUFFER_BIT);
        glfwSwapBuffers(window);
        glfwWaitEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}